

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O0

void __thiscall
skiplist<int,std::less<int>>::
skiplist<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (skiplist<int,std::less<int>> *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last)

{
  bool bVar1;
  reference piVar2;
  skiplist<int,_std::less<int>_> *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  this_local = (skiplist<int,_std::less<int>_> *)last._M_current;
  last_local = first;
  std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::vector
            ((vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> *)this);
  *(undefined4 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)(this + 0x28));
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)(this + 0x9f0));
  skiplist<int,_std::less<int>_>::_setup_random_number_generator
            ((skiplist<int,_std::less<int>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_local,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &this_local);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&last_local);
    skiplist<int,_std::less<int>_>::insert((skiplist<int,_std::less<int>_> *)this,*piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&last_local);
  }
  return;
}

Assistant:

skiplist(InputIterator first, InputIterator last): size_(0), last(nullptr) {
        _setup_random_number_generator();
        // last and size_ are taken care of during insertion.
        while(first != last) {
            insert(*first);
            ++first;
        }
    }